

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

void ZSTD_buildFSETable(ZSTD_seqSymbol *dt,short *normalizedCounter,uint maxSymbolValue,
                       U32 *baseValue,U8 *nbAdditionalBits,uint tableLog,void *wksp,size_t wkspSize,
                       int bmi2)

{
  short sVar1;
  byte bVar2;
  ulong uVar3;
  byte bVar4;
  uint uVar5;
  long lVar6;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  ushort uVar10;
  uint uVar11;
  uint uVar12;
  size_t u;
  long lVar13;
  uint uVar14;
  int iVar15;
  undefined4 uVar16;
  uint uVar17;
  long lVar18;
  
  if (bmi2 != 0) {
    ZSTD_buildFSETable_body_bmi2
              (dt,normalizedCounter,maxSymbolValue,baseValue,nbAdditionalBits,tableLog,wksp,wkspSize
              );
    return;
  }
  uVar16 = 1;
  bVar2 = (byte)tableLog;
  uVar11 = 1 << (bVar2 & 0x1f);
  if (0x34 < maxSymbolValue) {
    __assert_fail("maxSymbolValue <= MaxSeq",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0xa655,
                  "void ZSTD_buildFSETable_body(ZSTD_seqSymbol *, const short *, unsigned int, const U32 *, const U8 *, unsigned int, void *, size_t)"
                 );
  }
  if (9 < tableLog) {
    __assert_fail("tableLog <= MaxFSELog",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0xa656,
                  "void ZSTD_buildFSETable_body(ZSTD_seqSymbol *, const short *, unsigned int, const U32 *, const U8 *, unsigned int, void *, size_t)"
                 );
  }
  if (wkspSize < 0x272) {
    __assert_fail("wkspSize >= ZSTD_BUILD_FSE_TABLE_WKSP_SIZE",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0xa657,
                  "void ZSTD_buildFSETable_body(ZSTD_seqSymbol *, const short *, unsigned int, const U32 *, const U8 *, unsigned int, void *, size_t)"
                 );
  }
  uVar5 = maxSymbolValue + 1;
  lVar6 = (long)wksp + 0x6a;
  uVar7 = uVar11 - 1;
  uVar12 = (uint)(0x8000 << (bVar2 & 0x1f)) >> 0x10;
  uVar14 = uVar7;
  for (uVar3 = 0; uVar5 != uVar3; uVar3 = uVar3 + 1) {
    uVar10 = normalizedCounter[uVar3];
    if (uVar10 == 0xffff) {
      uVar9 = (ulong)uVar14;
      uVar14 = uVar14 - 1;
      dt[uVar9 + 1].baseValue = (U32)uVar3;
      uVar10 = 1;
    }
    else {
      if ((short)uVar10 < 0) {
        __assert_fail("normalizedCounter[s]>=0",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0xa665,
                      "void ZSTD_buildFSETable_body(ZSTD_seqSymbol *, const short *, unsigned int, const U32 *, const U8 *, unsigned int, void *, size_t)"
                     );
      }
      if (uVar12 < uVar10 || uVar12 == uVar10) {
        uVar16 = 0;
      }
    }
    *(ushort *)((long)wksp + uVar3 * 2) = uVar10;
  }
  dt->nextState = (short)uVar16;
  dt->nbAdditionalBits = (char)((uint)uVar16 >> 0x10);
  dt->nbBits = (char)((uint)uVar16 >> 0x18);
  dt->baseValue = tableLog;
  if (uVar14 == uVar7) {
    iVar15 = (uVar11 >> 3) + (uVar11 >> 1) + 3;
    lVar13 = 0;
    lVar8 = 0;
    for (uVar14 = 0; uVar14 != uVar5; uVar14 = uVar14 + 1) {
      sVar1 = normalizedCounter[uVar14];
      *(long *)((long)wksp + lVar8 + 0x6a) = lVar13;
      for (lVar18 = 0x72; lVar18 + -0x6a < (long)sVar1; lVar18 = lVar18 + 8) {
        *(long *)((long)wksp + lVar18 + lVar8) = lVar13;
      }
      if (sVar1 < 0) {
        __assert_fail("n>=0",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0xa687,
                      "void ZSTD_buildFSETable_body(ZSTD_seqSymbol *, const short *, unsigned int, const U32 *, const U8 *, unsigned int, void *, size_t)"
                     );
      }
      lVar8 = lVar8 + sVar1;
      lVar13 = lVar13 + 0x101010101010101;
    }
    if ((uVar11 & 1) != 0) {
      __assert_fail("tableSize % unroll == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0xa695,
                    "void ZSTD_buildFSETable_body(ZSTD_seqSymbol *, const short *, unsigned int, const U32 *, const U8 *, unsigned int, void *, size_t)"
                   );
    }
    uVar14 = 0;
    for (uVar3 = 0; uVar3 < uVar11; uVar3 = uVar3 + 2) {
      uVar5 = uVar14;
      for (lVar8 = 0; lVar8 != 2; lVar8 = lVar8 + 1) {
        dt[(ulong)(uVar5 & uVar7) + 1].baseValue = (uint)*(byte *)(lVar6 + lVar8);
        uVar5 = uVar5 + iVar15;
      }
      uVar14 = uVar14 + iVar15 * 2 & uVar7;
      lVar6 = lVar6 + 2;
    }
    if (uVar14 != 0) {
      __assert_fail("position == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0xa69e,
                    "void ZSTD_buildFSETable_body(ZSTD_seqSymbol *, const short *, unsigned int, const U32 *, const U8 *, unsigned int, void *, size_t)"
                   );
    }
  }
  else {
    uVar9 = 0;
    for (uVar3 = 0; uVar3 != uVar5; uVar3 = uVar3 + 1) {
      uVar10 = normalizedCounter[uVar3];
      uVar12 = 0;
      if ((short)uVar10 < 1) {
        uVar10 = 0;
      }
      for (; uVar12 != uVar10; uVar12 = uVar12 + 1) {
        dt[uVar9 + 1].baseValue = (U32)uVar3;
        do {
          uVar17 = (int)uVar9 + (uVar11 >> 3) + (uVar11 >> 1) + 3 & uVar7;
          uVar9 = (ulong)uVar17;
        } while (uVar14 < uVar17);
      }
    }
    if ((int)uVar9 != 0) {
      __assert_fail("position == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0xa6ac,
                    "void ZSTD_buildFSETable_body(ZSTD_seqSymbol *, const short *, unsigned int, const U32 *, const U8 *, unsigned int, void *, size_t)"
                   );
    }
  }
  uVar3 = 0;
  while( true ) {
    if (uVar11 == uVar3) {
      return;
    }
    uVar9 = (ulong)dt[uVar3 + 1].baseValue;
    uVar10 = *(ushort *)((long)wksp + uVar9 * 2);
    *(ushort *)((long)wksp + uVar9 * 2) = uVar10 + 1;
    iVar15 = 0x1f;
    if (uVar10 != 0) {
      for (; uVar10 >> iVar15 == 0; iVar15 = iVar15 + -1) {
      }
    }
    bVar4 = bVar2 - (char)iVar15;
    dt[uVar3 + 1].nbBits = bVar4;
    dt[uVar3 + 1].nextState = (uVar10 << (bVar4 & 0x1f)) - (short)uVar11;
    if (nbAdditionalBits[uVar9] == 0xff) break;
    dt[uVar3 + 1].nbAdditionalBits = nbAdditionalBits[uVar9];
    dt[uVar3 + 1].baseValue = baseValue[uVar9];
    uVar3 = uVar3 + 1;
  }
  __assert_fail("nbAdditionalBits[symbol] < 255",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                ,0xa6b7,
                "void ZSTD_buildFSETable_body(ZSTD_seqSymbol *, const short *, unsigned int, const U32 *, const U8 *, unsigned int, void *, size_t)"
               );
}

Assistant:

void ZSTD_buildFSETable(ZSTD_seqSymbol* dt,
            const short* normalizedCounter, unsigned maxSymbolValue,
            const U32* baseValue, const U8* nbAdditionalBits,
            unsigned tableLog, void* wksp, size_t wkspSize, int bmi2)
{
#if DYNAMIC_BMI2
    if (bmi2) {
        ZSTD_buildFSETable_body_bmi2(dt, normalizedCounter, maxSymbolValue,
                baseValue, nbAdditionalBits, tableLog, wksp, wkspSize);
        return;
    }
#endif
    (void)bmi2;
    ZSTD_buildFSETable_body_default(dt, normalizedCounter, maxSymbolValue,
            baseValue, nbAdditionalBits, tableLog, wksp, wkspSize);
}